

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

TranslationBlock *
tb_gen_code_mips64(CPUState *cpu,target_ulong pc,target_ulong cs_base,uint32_t flags,int cflags)

{
  TCGContext_conflict5 *s;
  CPUArchState_conflict11 *env;
  void *pvVar1;
  TCGContext_conflict6 *pTVar2;
  uc_struct_conflict6 *uc;
  CPUState *pCVar3;
  uint32_t hash;
  tb_page_addr_t phys1;
  TranslationBlock *tb;
  uint8_t *p_00;
  tb_page_addr_t phys2;
  TranslationBlock *pTVar4;
  target_ulong tVar5;
  ulong uVar6;
  uint uVar7;
  TranslationBlock *pTVar8;
  long lVar9;
  uint uVar10;
  uintptr_t orig_aligned;
  ulong uVar11;
  TranslationBlock *pTVar12;
  uint local_ac;
  PageDesc *p2;
  uint32_t local_90;
  uint32_t local_8c;
  CPUState *local_88;
  target_ulong local_80;
  PageDesc *p;
  CPUArchState_conflict11 *local_70;
  uint8_t *local_68;
  size_t local_60;
  target_ulong local_58;
  CPUState *local_50;
  uint8_t *local_48;
  ulong local_40;
  TranslationBlock *local_38;
  
  s = (TCGContext_conflict5 *)cpu->uc->tcg_ctx;
  env = (CPUArchState_conflict11 *)cpu->env_ptr;
  local_8c = flags;
  local_80 = pc;
  local_58 = cs_base;
  phys1 = get_page_addr_code_mips64(env,pc);
  uVar10 = cflags | 0x10000;
  if (phys1 != 0xffffffffffffffff) {
    uVar10 = cflags;
  }
  local_90 = cpu->cluster_index << 0x18 | uVar10 & 0xffffff;
  uVar10 = uVar10 & 0x7fff;
  uVar7 = 0x200;
  if (uVar10 < 0x200) {
    uVar7 = uVar10;
  }
  if (uVar10 == 0) {
    uVar7 = 0x200;
  }
  local_ac = 1;
  if (cpu->singlestep_enabled == 0) {
    local_ac = uVar7;
  }
  local_50 = (CPUState *)(env[-3].tcs[0xc].gpr + 0x12);
  local_88 = cpu;
  local_70 = env;
LAB_007b6aec:
  do {
    tb = tcg_tb_alloc_mips64(s);
    if (tb == (TranslationBlock *)0x0) {
      tb_flush_mips64(cpu);
      cpu->exception_index = 0x10000;
      cpu_loop_exit_mips64(cpu);
    }
    pvVar1 = s->code_gen_ptr;
    (tb->tc).ptr = pvVar1;
    tb->pc = local_80;
    tb->cs_base = local_58;
    tb->flags = local_8c;
    tb->cflags = local_90;
    tb->orig_tb = (TranslationBlock *)0x0;
    tb->trace_vcpu_dstate = (uint32_t)cpu->trace_dstate[0];
    s->tb_cflags = local_90;
    while( true ) {
      tcg_func_start_mips64(s);
      s->cpu = local_50;
      gen_intermediate_code_mips64(cpu,tb,local_ac);
      s->cpu = (CPUState *)0x0;
      tb->jmp_reset_offset[0] = 0xffff;
      tb->jmp_reset_offset[1] = 0xffff;
      s->tb_jmp_reset_offset = tb->jmp_reset_offset;
      s->tb_jmp_insn_offset = tb->jmp_target_arg;
      s->tb_jmp_target_addr = (uintptr_t *)0x0;
      uVar10 = tcg_gen_code_mips64(s,tb);
      if (-1 < (int)uVar10) break;
      if (uVar10 != 0xfffffffe) {
        if (uVar10 != 0xffffffff) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                     ,0x711,(char *)0x0);
        }
        goto LAB_007b6aec;
      }
      local_ac = (uint)(tb->icount >> 1);
      if (tb->icount < 2) {
        __assert_fail("max_insns > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x70c,
                      "TranslationBlock *tb_gen_code_mips64(CPUState *, target_ulong, target_ulong, uint32_t, int)"
                     );
      }
    }
    local_60 = (size_t)uVar10;
    p_00 = (uint8_t *)(local_60 + (long)pvVar1);
    pTVar2 = cpu->uc->tcg_ctx;
    local_48 = (uint8_t *)pTVar2->code_gen_highwater;
    local_40 = (ulong)tb->icount;
    pTVar12 = (TranslationBlock *)(pTVar2->gen_insn_end_off + 500);
    uVar11 = 0;
    local_68 = p_00;
    do {
      pCVar3 = local_88;
      if (uVar11 == local_40) {
        uVar10 = (int)p_00 - (int)local_68;
        cpu = local_88;
        if (-1 < (int)uVar10) {
          (tb->tc).size = local_60;
          s->code_gen_ptr =
               (void *)((long)pvVar1 + (uVar10 & 0x7fffffff) + local_60 + 0xf & 0xfffffffffffffff0);
          tb->jmp_dest[1] = 0;
          *(undefined1 (*) [16])(tb->jmp_list_next + 1) = (undefined1  [16])0x0;
          tb->jmp_list_head = 0;
          tb->jmp_list_next[0] = 0;
          if (tb->jmp_reset_offset[0] != 0xffff) {
            tb_reset_jump(tb,0);
          }
          if (tb->jmp_reset_offset[1] != 0xffff) {
            tb_reset_jump(tb,1);
          }
          uVar11 = (local_80 + tb->size) - 1 & 0xfffffffffffff000;
          if ((local_80 & 0xfffffffffffff000) == uVar11) {
            phys2 = 0xffffffffffffffff;
          }
          else {
            phys2 = get_page_addr_code_mips64(local_70,uVar11);
          }
          uc = (uc_struct_conflict6 *)pCVar3->uc;
          p2 = (PageDesc *)0x0;
          if (phys1 == 0xffffffffffffffff) {
            if ((tb->cflags & 0x10000) == 0) {
              __assert_fail("tb->cflags & CF_NOCACHE",
                            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                            ,0x66c,
                            "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                           );
            }
            *(undefined4 *)tb->page_addr = 0xffffffff;
            *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
            *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
            *(undefined4 *)((long)tb->page_addr + 0xc) = 0xffffffff;
          }
          else {
            page_lock_pair(uc,&p,phys1,&p2,phys2,1);
            tb_page_add(uc,p,tb,0,phys1 & 0xfffffffffffff000);
            if (p2 == (PageDesc *)0x0) {
              tb->page_addr[1] = 0xffffffffffffffff;
            }
            else {
              tb_page_add(uc,p2,tb,1,phys2);
            }
            if ((tb->cflags >> 0x10 & 1) == 0) {
              local_38 = (TranslationBlock *)0x0;
              hash = tb_hash_func(phys1,tb->pc,tb->flags,tb->cflags & 0xff0affff,
                                  tb->trace_vcpu_dstate);
              tb->hash = hash;
              qht_insert((uc_struct_conflict5 *)uc,&(uc->tcg_ctx->tb_ctx).htable,tb,hash,&local_38);
              if (local_38 != (TranslationBlock *)0x0) {
                tb_page_remove(p,tb);
                invalidate_page_bitmap(p);
                if (p2 != (PageDesc *)0x0) {
                  tb_page_remove(p2,tb);
                  invalidate_page_bitmap(p2);
                }
                if (local_38 != tb) {
                  lVar9 = (long)s->uc->qemu_icache_linesize;
                  s->code_gen_ptr = (void *)((long)pvVar1 - (-lVar9 & lVar9 + 0x9fU));
                  return local_38;
                }
              }
            }
          }
          tcg_tb_insert_mips64(s,tb);
          return tb;
        }
        break;
      }
      pTVar8 = pTVar12;
      for (lVar9 = 0; lVar9 != -3; lVar9 = lVar9 + -1) {
        pTVar4 = pTVar8;
        if ((uVar11 == 0) && (pTVar4 = tb, lVar9 != 0)) {
          tVar5 = 0;
        }
        else {
          tVar5 = pTVar4->pc;
        }
        p_00 = encode_sleb128(p_00,*(long *)&pTVar8->cflags - tVar5);
        pTVar8 = (TranslationBlock *)&pTVar8->cs_base;
      }
      if (uVar11 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)pTVar2->gen_insn_end_off[uVar11 - 1];
      }
      p_00 = encode_sleb128(p_00,pTVar2->gen_insn_end_off[uVar11] - uVar6);
      uVar11 = uVar11 + 1;
      pTVar12 = (TranslationBlock *)&pTVar12->cflags;
      cpu = local_88;
    } while (p_00 <= local_48);
  } while( true );
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}